

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void Cmd_atexit(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  GameAtExit *pGVar3;
  char *copyStr;
  FString FStack_28;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Registered atexit commands:\n");
    for (pGVar3 = ExitCmdList; pGVar3 != (GameAtExit *)0x0; pGVar3 = pGVar3->Next) {
      Printf("%s\n",(pGVar3->Command).Chars);
    }
  }
  else {
    iVar1 = FCommandLine::argc(argv);
    if (1 < iVar1) {
      iVar1 = 1;
      do {
        pGVar3 = (GameAtExit *)operator_new(0x10);
        copyStr = FCommandLine::operator[](argv,iVar1);
        FString::FString(&FStack_28,copyStr);
        FString::AttachToOther(&pGVar3->Command,&FStack_28);
        FString::~FString(&FStack_28);
        pGVar3->Next = ExitCmdList;
        iVar1 = iVar1 + 1;
        ExitCmdList = pGVar3;
        iVar2 = FCommandLine::argc(argv);
      } while (iVar1 < iVar2);
    }
  }
  return;
}

Assistant:

CCMD (atexit)
{
	if (argv.argc() == 1)
	{
		Printf ("Registered atexit commands:\n");
		GameAtExit *record = ExitCmdList;
		while (record != NULL)
		{
			Printf ("%s\n", record->Command.GetChars());
			record = record->Next;
		}
		return;
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		GameAtExit *record = new GameAtExit(argv[i]);
		record->Next = ExitCmdList;
		ExitCmdList = record;
	}
}